

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::~PromiseDataBase
          (PromiseDataBase<int,_void_(const_int_&)> *this)

{
  code *pcVar1;
  PromiseDataBase<int,_void_(const_int_&)> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~PromiseDataBase() { }